

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

QString * runCommandAsUserArgs(QString *__return_storage_ptr__,QString *cmd)

{
  ulong in_RDX;
  long in_FS_OFFSET;
  QAnyStringView QVar1;
  undefined1 local_70 [8];
  QString *local_68;
  ulong local_60;
  undefined1 local_58 [8];
  char16_t *local_50;
  ulong local_48;
  undefined1 local_40 [8];
  char16_t *local_38;
  ulong local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined8 local_10;
  QString *local_8;
  
  local_8 = *(QString **)(in_FS_OFFSET + 0x28);
  local_30 = g_options.package.d.size | 0x8000000000000000;
  local_28 = local_40;
  local_40[0] = 1;
  local_38 = g_options.package.d.ptr;
  local_48 = g_testInfo.userId.d.size | 0x8000000000000000;
  local_20 = local_58;
  local_58[0] = 1;
  local_50 = g_testInfo.userId.d.ptr;
  local_60 = in_RDX | 0x8000000000000000;
  local_18 = local_70;
  local_70[0] = 1;
  local_10 = 0;
  QVar1.m_size = (size_t)"run-as %1 --user %2 %3";
  QVar1.field_0.m_data = __return_storage_ptr__;
  local_68 = cmd;
  QtPrivate::argToQString(QVar1,0x4000000000000016,(ArgBase **)0x3);
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_8) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString runCommandAsUserArgs(const QString &cmd)
{
    return "run-as %1 --user %2 %3"_L1.arg(g_options.package, g_testInfo.userId, cmd);
}